

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O3

int proc_install(void)

{
  int iVar1;
  int iVar2;
  t_proc *ptVar3;
  t_proc **pptVar4;
  int iVar5;
  
  ptVar3 = (t_proc *)malloc(0x78);
  if (ptVar3 == (t_proc *)0x0) {
    error("Out of memory!");
    iVar2 = 0;
  }
  else {
    strcpy(ptVar3->name,symbol + 1);
    iVar1 = symhash();
    iVar2 = optype;
    ptVar3->bank = (optype == 0x2f) + 0xf1;
    iVar5 = 0;
    if (proc_ptr != (t_proc *)0x0) {
      iVar5 = loccnt;
    }
    ptVar3->base = iVar5;
    ptVar3->org = iVar5;
    ptVar3->size = 0;
    ptVar3->call = 0;
    ptVar3->refcnt = 0;
    ptVar3->link = (t_proc *)0x0;
    ptVar3->next = proc_tbl[iVar1];
    ptVar3->group = proc_ptr;
    ptVar3->type = iVar2;
    pptVar4 = &proc_last->link;
    if (proc_first == (t_proc *)0x0) {
      pptVar4 = &proc_first;
    }
    proc_ptr = ptVar3;
    proc_tbl[iVar1] = ptVar3;
    *pptVar4 = ptVar3;
    iVar2 = 1;
    proc_last = ptVar3;
  }
  return iVar2;
}

Assistant:

int
proc_install(void)
{
	struct t_proc *ptr;
	int hash;

	/* allocate a new proc struct */
	if ((ptr = (void *)malloc(sizeof(struct t_proc))) == NULL) {
		error("Out of memory!");
		return (0);
	}

	/* initialize it */
	strcpy(ptr->name, &symbol[1]);
	hash = symhash();
	ptr->bank = (optype == P_PGROUP)  ? GROUP_BANK : PROC_BANK;
	ptr->base = proc_ptr ? loccnt : 0;
	ptr->org = ptr->base;
	ptr->size = 0;
	ptr->call = 0;
	ptr->refcnt = 0;
	ptr->link = NULL;
	ptr->next = proc_tbl[hash];
	ptr->group = proc_ptr;
	ptr->type = optype;
	proc_ptr = ptr;
	proc_tbl[hash] = proc_ptr;

	/* link it */
	if (proc_first == NULL) {
		proc_first = proc_ptr;
		proc_last  = proc_ptr;
	}
	else {
		proc_last->link = proc_ptr;
		proc_last = proc_ptr;
	}

	/* ok */
	return (1);
}